

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O2

void test_sort_helper(secp256k1_pubkey *pk,size_t *pk_order,size_t n_pk)

{
  int iVar1;
  size_t sVar2;
  secp256k1_pubkey *pk_test [5];
  
  for (sVar2 = 0; n_pk != sVar2; sVar2 = sVar2 + 1) {
    pk_test[sVar2] = pk + pk_order[sVar2];
  }
  secp256k1_pubkey_sort(CTX,pk_test,n_pk);
  sVar2 = 0;
  do {
    if (n_pk == sVar2) {
      return;
    }
    iVar1 = secp256k1_memcmp_var(pk_test[sVar2],pk,0x40);
    sVar2 = sVar2 + 1;
    pk = pk + 1;
  } while (iVar1 == 0);
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
          ,0x281,
          "test condition failed: secp256k1_memcmp_var(pk_test[i], &pk[i], sizeof(*pk_test[i])) == 0"
         );
  abort();
}

Assistant:

static void test_sort_helper(secp256k1_pubkey *pk, size_t *pk_order, size_t n_pk) {
    size_t i;
    const secp256k1_pubkey *pk_test[5];

    for (i = 0; i < n_pk; i++) {
        pk_test[i] = &pk[pk_order[i]];
    }
    secp256k1_pubkey_sort(CTX, pk_test, n_pk);
    for (i = 0; i < n_pk; i++) {
        CHECK(secp256k1_memcmp_var(pk_test[i], &pk[i], sizeof(*pk_test[i])) == 0);
    }
}